

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustr_titlecase_brkiter.cpp
# Opt level: O2

int32_t ucasemap_toTitle_63(UCaseMap *csm,UChar *dest,int32_t destCapacity,UChar *src,
                           int32_t srcLength,UErrorCode *pErrorCode)

{
  int32_t iVar1;
  BreakIterator *pBVar2;
  ConstChar16Ptr local_88;
  UChar *local_80;
  UnicodeString s;
  
  iVar1 = 0;
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if (*(long *)csm == 0) {
      s.super_Replaceable.super_UObject._vptr_UObject = (UObject)(_func_int **)0x0;
      pBVar2 = ustrcase_getTitleBreakIterator_63
                         ((Locale *)0x0,(char *)(csm + 8),*(uint32_t *)(csm + 0x2c),
                          (BreakIterator *)0x0,(LocalPointer<icu_63::BreakIterator> *)&s,pErrorCode)
      ;
      if (pBVar2 == (BreakIterator *)0x0) {
        if (s.super_Replaceable.super_UObject._vptr_UObject != (_func_int **)0x0) {
          (**(code **)(*(long *)s.super_Replaceable.super_UObject._vptr_UObject + 8))();
        }
        return 0;
      }
      *(UObject *)csm = s.super_Replaceable.super_UObject._vptr_UObject;
    }
    local_88.p_ = src;
    icu_63::UnicodeString::UnicodeString(&s,(byte)((uint)srcLength >> 0x1f),&local_88,srcLength);
    local_80 = local_88.p_;
    (**(code **)(**(long **)csm + 0x38))(*(long **)csm,&s);
    iVar1 = ustrcase_map_63(*(int32_t *)(csm + 0x28),*(uint32_t *)(csm + 0x2c),
                            *(BreakIterator **)csm,dest,destCapacity,src,srcLength,
                            ustrcase_internalToTitle_63,(Edits *)0x0,pErrorCode);
    icu_63::UnicodeString::~UnicodeString(&s);
  }
  return iVar1;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucasemap_toTitle(UCaseMap *csm,
                 UChar *dest, int32_t destCapacity,
                 const UChar *src, int32_t srcLength,
                 UErrorCode *pErrorCode) {
    if (U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if (csm->iter == NULL) {
        LocalPointer<BreakIterator> ownedIter;
        BreakIterator *iter = ustrcase_getTitleBreakIterator(
            nullptr, csm->locale, csm->options, nullptr, ownedIter, *pErrorCode);
        if (iter == nullptr) {
            return 0;
        }
        csm->iter = ownedIter.orphan();
    }
    UnicodeString s(srcLength<0, src, srcLength);
    csm->iter->setText(s);
    return ustrcase_map(
        csm->caseLocale, csm->options, csm->iter,
        dest, destCapacity,
        src, srcLength,
        ustrcase_internalToTitle, NULL, *pErrorCode);
}